

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagateNoContraction.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ae0418::TSymbolDefinitionCollectingTraverser::visitSymbol
          (TSymbolDefinitionCollectingTraverser *this,TIntermSymbol *node)

{
  mapped_type *this_00;
  TIntermSymbol *in_RDX;
  TIntermSymbol *local_40;
  ObjectAccessChain local_38;
  TIntermSymbol *local_18;
  TIntermSymbol *node_local;
  TSymbolDefinitionCollectingTraverser *this_local;
  
  local_18 = node;
  node_local = (TIntermSymbol *)this;
  (anonymous_namespace)::generateSymbolLabel_abi_cxx11_
            (&local_38,(_anonymous_namespace_ *)node,in_RDX);
  std::__cxx11::string::operator=((string *)&this->current_object_,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_40 = local_18;
  this_00 = std::
            unordered_map<glslang::TIntermTyped_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<glslang::TIntermTyped_*>,_std::equal_to<glslang::TIntermTyped_*>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this->accesschain_mapping_,(key_type *)&local_40);
  std::__cxx11::string::operator=((string *)this_00,(string *)&this->current_object_);
  return;
}

Assistant:

void TSymbolDefinitionCollectingTraverser::visitSymbol(glslang::TIntermSymbol* node)
{
    current_object_ = generateSymbolLabel(node);
    accesschain_mapping_[node] = current_object_;
}